

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
          (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key)

{
  long lVar1;
  long lVar2;
  JavascriptString *pJVar3;
  char16_t *string2;
  DictionaryStats *this_00;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  charcount_t cVar7;
  int iVar8;
  undefined4 *puVar9;
  char16 *pcVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  hash_t hashCode;
  uint depth;
  
  lVar2 = *(long *)this;
  depth = 0;
  if (lVar2 != 0) {
    if ((ulong)key->len == 0) {
      hashCode = 0x2393b8b;
    }
    else {
      uVar12 = 0x811c9dc5;
      uVar11 = 0;
      do {
        uVar14 = (ushort)(key->string).ptr[uVar11] ^ uVar12;
        uVar12 = uVar14 * 0x1000193;
        uVar11 = uVar11 + 1;
      } while (key->len != uVar11);
      hashCode = uVar14 * 0x2000326 + 1;
    }
    uVar6 = BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
            ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar12 = *(uint *)(lVar2 + (ulong)uVar6 * 4);
    if (-1 < (int)uVar12) {
      lVar2 = *(long *)(this + 8);
      depth = 0;
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pJVar3 = *(JavascriptString **)(lVar2 + 8 + (ulong)uVar12 * 0x18);
        pcVar10 = Js::JavascriptString::GetString(pJVar3);
        cVar7 = Js::JavascriptString::GetLength(pJVar3);
        if (cVar7 == 0) {
          iVar8 = 0x2393b8b;
        }
        else {
          uVar14 = 0x811c9dc5;
          uVar11 = 0;
          do {
            uVar13 = (ushort)pcVar10[uVar11] ^ uVar14;
            uVar14 = uVar13 * 0x1000193;
            uVar11 = uVar11 + 1;
          } while (cVar7 != uVar11);
          iVar8 = uVar13 * 0x2000326 + 1;
        }
        lVar1 = lVar2 + (ulong)uVar12 * 0x18;
        if (iVar8 != *(int *)(lVar1 + 0x10)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                             ,199,
                             "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                             ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
          if (!bVar5) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar9 = 0;
        }
        if (*(hash_t *)(lVar1 + 0x10) == hashCode) {
          pJVar3 = *(JavascriptString **)(lVar1 + 8);
          cVar7 = Js::JavascriptString::GetLength(pJVar3);
          if (cVar7 == key->len) {
            pcVar10 = Js::JavascriptString::GetString(pJVar3);
            string2 = (key->string).ptr;
            cVar7 = Js::JavascriptString::GetLength(pJVar3);
            if ((pcVar10 == string2) ||
               (iVar8 = PAL_wmemcmp(pcVar10,string2,(ulong)cVar7), iVar8 == 0)) {
              this_00 = *(DictionaryStats **)(this + 0x30);
              goto joined_r0x00e4045e;
            }
          }
        }
        depth = depth + 1;
        uVar12 = *(uint *)(lVar1 + 4);
      } while (-1 < (int)uVar12);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar12 = 0xffffffff;
joined_r0x00e4045e:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  return uVar12;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }